

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall create::Create::setAllMotors(Create *this,float *main,float *side,float *vacuum)

{
  ProtocolVersion PVar1;
  element_type *peVar2;
  ssize_t sVar3;
  byte bVar4;
  size_t sVar5;
  int in_R8D;
  int __flags;
  float fVar6;
  undefined1 local_36;
  uint8_t local_35;
  uint8_t local_34;
  uint8_t local_33;
  undefined1 local_32;
  byte local_31;
  uint8_t cmd [4];
  float *pfStack_30;
  uint8_t cmd_1 [2];
  float *vacuum_local;
  float *side_local;
  float *main_local;
  Create *this_local;
  
  if ((((*main < -1.0) || (1.0 < *main)) || (*side < -1.0)) ||
     (((1.0 < *side || (*vacuum < -1.0)) || (1.0 < *vacuum)))) {
    this_local._7_1_ = false;
  }
  else {
    pfStack_30 = vacuum;
    fVar6 = roundf(*main * 127.0);
    this->mainMotorPower = (uint8_t)(int)fVar6;
    fVar6 = roundf(*side * 127.0);
    sVar5 = (size_t)(uint)(int)fVar6;
    this->sideMotorPower = (uint8_t)(int)fVar6;
    fVar6 = roundf(*pfStack_30 * 127.0);
    this->vacuumMotorPower = (uint8_t)(int)fVar6;
    PVar1 = RobotModel::getVersion(&this->model);
    if (PVar1 == V_1) {
      local_32 = 0x8a;
      bVar4 = 0;
      if (*pfStack_30 != 0.0) {
        bVar4 = 2;
      }
      sVar5 = 0;
      __flags = CONCAT31((int3)((uint)in_R8D >> 8),NAN(*main));
      if (*main != 0.0) {
        sVar5 = 4;
      }
      local_31 = *side != 0.0 | bVar4 | (byte)sVar5;
      peVar2 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->serial);
      sVar3 = Serial::send(peVar2,(int)&local_32,(void *)0x2,sVar5,__flags);
      this_local._7_1_ = (bool)((byte)sVar3 & 1);
    }
    else {
      local_36 = 0x90;
      local_35 = this->mainMotorPower;
      local_34 = this->sideMotorPower;
      local_33 = this->vacuumMotorPower;
      peVar2 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->serial);
      sVar3 = Serial::send(peVar2,(int)&local_36,(void *)0x4,sVar5,in_R8D);
      this_local._7_1_ = (bool)((byte)sVar3 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Create::setAllMotors(const float& main, const float& side, const float& vacuum) {
    if (main < -1.0 || main > 1.0 ||
        side < -1.0 || side > 1.0 ||
        vacuum < -1.0 || vacuum > 1.0)
      return false;

    mainMotorPower = roundf(main * 127);
    sideMotorPower = roundf(side * 127);
    vacuumMotorPower = roundf(vacuum * 127);

    if (model.getVersion() == V_1) {
        uint8_t cmd[2] = { OC_MOTORS,
                           static_cast<uint8_t>((side != 0.0 ? 1 : 0) |
                                     (vacuum != 0.0 ? 2 : 0) |
                                     (main != 0.0 ? 4 : 0))
                         };
        return serial->send(cmd, 2);
    }

    uint8_t cmd[4] = { OC_MOTORS_PWM,
                       mainMotorPower,
                       sideMotorPower,
                       vacuumMotorPower
                     };

    return serial->send(cmd, 4);
  }